

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  bool bVar2;
  _func_void_int_int *p_Var3;
  char *__s1;
  ImGuiWindow **ppIVar4;
  unsigned_short *puVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *pIVar8;
  float fVar9;
  ImU32 key;
  ImGuiWindow *pIVar10;
  ImGuiWindow **ppIVar11;
  ulong uVar12;
  unsigned_short *__dest;
  byte bVar13;
  uint uVar14;
  char *pcVar15;
  char *label;
  int iVar16;
  long lVar17;
  ImGuiContext *g_1;
  int iVar18;
  ulong uVar19;
  ImGuiContext *g;
  uint uVar20;
  float fVar21;
  float fVar22;
  ImRect local_48;
  
  pIVar8 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x1066,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    if (GImGui->WithinFrameScope == false) {
      __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                    ,0x106b,"void ImGui::EndFrame()");
    }
    bVar2 = (GImGui->IO).KeyCtrl;
    uVar14 = bVar2 + 2;
    if ((GImGui->IO).KeyShift == false) {
      uVar14 = (uint)bVar2;
    }
    uVar20 = uVar14 + 4;
    if ((GImGui->IO).KeyAlt == false) {
      uVar20 = uVar14;
    }
    uVar14 = uVar20 + 8;
    if ((GImGui->IO).KeySuper == false) {
      uVar14 = uVar20;
    }
    if ((GImGui->IO).KeyMods != uVar14) {
      __assert_fail("g.IO.KeyMods == expected_key_mod_flags && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                    ,0x1af0,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    iVar16 = (GImGui->CurrentWindowStack).Size;
    if (iVar16 != 1) {
      if (iVar16 < 2) {
        __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                      ,0x1aff,"void ImGui::ErrorCheckEndFrameSanityChecks()");
      }
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                    ,0x1af9,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    p_Var3 = (GImGui->IO).ImeSetInputScreenPosFn;
    if (p_Var3 != (_func_void_int_int *)0x0) {
      fVar21 = (GImGui->PlatformImeLastPos).x;
      if (((fVar21 == 3.4028235e+38) && (!NAN(fVar21))) ||
         (fVar21 = fVar21 - (GImGui->PlatformImePos).x,
         fVar22 = (GImGui->PlatformImeLastPos).y - (GImGui->PlatformImePos).y,
         0.0001 < fVar21 * fVar21 + fVar22 * fVar22)) {
        (*p_Var3)((int)(GImGui->PlatformImePos).x,(int)(GImGui->PlatformImePos).y);
        pIVar8->PlatformImeLastPos = pIVar8->PlatformImePos;
      }
    }
    pIVar8->WithinFrameScopeWithImplicitWindow = false;
    pIVar10 = pIVar8->CurrentWindow;
    if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WriteAccessed == false)) {
      pIVar10->Active = false;
    }
    End();
    pIVar7 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar10 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar7->WindowsById,key);
        pIVar7->NavWindowingListWindow = pIVar10;
      }
      fVar21 = (pIVar7->IO).DisplaySize.x;
      fVar22 = (pIVar7->IO).DisplaySize.y;
      (pIVar7->NextWindowData).SizeConstraintRect.Min.x = fVar21 * 0.2;
      (pIVar7->NextWindowData).SizeConstraintRect.Min.y = fVar22 * 0.2;
      (pIVar7->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar7->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar7->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar7->NextWindowData).SizeCallbackUserData = (void *)0x0;
      *(byte *)&(pIVar7->NextWindowData).Flags = (byte)(pIVar7->NextWindowData).Flags | 0x11;
      IVar6.y = fVar22 * 0.5;
      IVar6.x = fVar21 * 0.5;
      (pIVar7->NextWindowData).PosVal = IVar6;
      (pIVar7->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar7->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar7->NextWindowData).PosCond = 1;
      fVar21 = (pIVar7->Style).WindowPadding.x;
      fVar22 = (pIVar7->Style).WindowPadding.y;
      local_48.Min.y = fVar22 + fVar22;
      local_48.Min.x = fVar21 + fVar21;
      PushStyleVar(1,&local_48.Min);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar17 = (long)(pIVar7->WindowsFocusOrder).Size;
      if (0 < lVar17) {
        do {
          if ((pIVar7->WindowsFocusOrder).Size < lVar17) goto LAB_00149c46;
          pIVar10 = (pIVar7->WindowsFocusOrder).Data[lVar17 + -1];
          if (((pIVar10->Active == true) && (pIVar10->RootWindow == pIVar10)) &&
             (uVar14 = pIVar10->Flags, (uVar14 >> 0x13 & 1) == 0)) {
            __s1 = pIVar10->Name;
            pcVar15 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar15 == '#') {
                  if (pcVar15[1] == '#') goto LAB_00149592;
                }
                else if (*pcVar15 == '\0') goto LAB_00149592;
                pcVar15 = pcVar15 + 1;
              } while (pcVar15 != (char *)0xffffffffffffffff);
              pcVar15 = (char *)0xffffffffffffffff;
            }
LAB_00149592:
            label = __s1;
            if ((__s1 == pcVar15) && (label = "(Popup)", (uVar14 >> 0x1a & 1) == 0)) {
              if ((uVar14 >> 10 & 1) != 0) {
                iVar16 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar16 == 0) goto LAB_001495cd;
              }
              label = "(Untitled)";
            }
LAB_001495cd:
            local_48.Min.x = 0.0;
            local_48.Min.y = 0.0;
            Selectable(label,pIVar7->NavWindowingTarget == pIVar10,0,&local_48.Min);
          }
          bVar2 = 1 < lVar17;
          lVar17 = lVar17 + -1;
        } while (bVar2);
      }
      End();
      PopStyleVar(1);
    }
    pIVar10 = pIVar7->NavWrapRequestWindow;
    if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar7->NavWindow == pIVar10)) &&
       ((GImGui->NavMoveRequest == true &&
        (((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
          (pIVar7->NavMoveRequestForward == ImGuiNavForward_None)) &&
         (pIVar7->NavLayer == ImGuiNavLayer_Main)))))) {
      uVar14 = pIVar7->NavWrapRequestFlags;
      if (uVar14 == 0) {
        __assert_fail("move_flags != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                      ,0x2355,"void ImGui::NavEndFrame()");
      }
      local_48.Min = pIVar10->NavRectRel[0].Min;
      local_48.Max = pIVar10->NavRectRel[0].Max;
      iVar16 = pIVar7->NavMoveDir;
      if (iVar16 == 0) {
        if ((uVar14 & 5) == 0) {
          iVar16 = 0;
        }
        else {
          fVar21 = (pIVar10->SizeFull).x;
          fVar22 = (pIVar10->WindowPadding).x;
          fVar22 = fVar22 + fVar22 + (pIVar10->ContentSize).x;
          uVar20 = -(uint)(fVar22 <= fVar21);
          fVar21 = (float)(uVar20 & (uint)fVar21 | ~uVar20 & (uint)fVar22) - (pIVar10->Scroll).x;
          iVar16 = 0;
          if ((uVar14 & 4) != 0) {
            fVar22 = local_48.Max.y - local_48.Min.y;
            local_48.Min.y = local_48.Min.y - fVar22;
            local_48.Max.y = local_48.Max.y - fVar22;
            iVar16 = 2;
          }
          local_48.Max.x = fVar21;
          local_48.Min.x = fVar21;
          NavMoveRequestForward(0,iVar16,&local_48,uVar14);
        }
      }
      if ((uVar14 & 5) != 0 && pIVar7->NavMoveDir == 1) {
        fVar21 = (pIVar10->Scroll).x;
        fVar9 = local_48.Max.y;
        local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar21) ^ 0x80000000);
        fVar22 = local_48.Min.y;
        local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar21) ^ 0x80000000);
        if ((uVar14 & 4) != 0) {
          fVar21 = fVar9 - fVar22;
          local_48.Min.y = fVar22 + fVar21;
          local_48.Max.y = fVar21 + fVar9;
          iVar16 = 3;
        }
        NavMoveRequestForward(pIVar7->NavMoveDir,iVar16,&local_48,uVar14);
      }
      if ((uVar14 & 10) != 0 && pIVar7->NavMoveDir == 2) {
        fVar21 = (pIVar10->SizeFull).y;
        fVar22 = (pIVar10->WindowPadding).y;
        fVar22 = fVar22 + fVar22 + (pIVar10->ContentSize).y;
        uVar20 = -(uint)(fVar22 <= fVar21);
        fVar21 = (float)(uVar20 & (uint)fVar21 | ~uVar20 & (uint)fVar22) - (pIVar10->Scroll).y;
        if ((uVar14 & 8) != 0) {
          fVar22 = local_48.Max.x - local_48.Min.x;
          local_48.Min.x = local_48.Min.x - fVar22;
          local_48.Max.x = local_48.Max.x - fVar22;
          iVar16 = 0;
        }
        local_48.Max.y = fVar21;
        local_48.Min.y = fVar21;
        NavMoveRequestForward(pIVar7->NavMoveDir,iVar16,&local_48,uVar14);
      }
      if (pIVar7->NavMoveDir == 3 && (uVar14 & 10) != 0) {
        fVar21 = (pIVar10->Scroll).y;
        fVar9 = local_48.Max.x;
        local_48.Max = (ImVec2)(CONCAT44(fVar21,local_48.Max.x) ^ 0x8000000000000000);
        fVar22 = local_48.Min.x;
        local_48.Min = (ImVec2)(CONCAT44(fVar21,local_48.Min.x) ^ 0x8000000000000000);
        if ((uVar14 & 8) != 0) {
          fVar21 = fVar9 - fVar22;
          local_48.Min.x = fVar22 + fVar21;
          local_48.Max.x = fVar21 + fVar9;
          iVar16 = 1;
        }
        NavMoveRequestForward(pIVar7->NavMoveDir,iVar16,&local_48,uVar14);
      }
    }
    if (pIVar8->DragDropActive == true) {
      if ((pIVar8->DragDropPayload).DataFrameCount + 1 < pIVar8->FrameCount) {
        bVar13 = 1;
        if ((pIVar8->DragDropSourceFlags & 0x20) == 0) {
          if (4 < (ulong)(uint)pIVar8->DragDropMouseButton) {
            __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                          ,0x118c,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
          }
          bVar13 = (GImGui->IO).MouseDown[(uint)pIVar8->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar13 = 0;
      }
      if ((bVar13 != 0) || ((pIVar8->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar8->DragDropActive == true) && (pIVar8->DragDropSourceFrameCount < pIVar8->FrameCount)
        ) && ((pIVar8->DragDropSourceFlags & 1) == 0)) {
      pIVar8->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar8->DragDropWithinSource = false;
    }
    pIVar8->WithinFrameScope = false;
    pIVar8->FrameCountEnded = pIVar8->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar16 = (pIVar8->WindowsTempSortBuffer).Capacity;
    if (iVar16 < 0) {
      uVar14 = iVar16 / 2 + iVar16;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar11 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar12 * 8,GImAllocatorUserData);
      ppIVar4 = (pIVar8->WindowsTempSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar11,ppIVar4,(long)(pIVar8->WindowsTempSortBuffer).Size << 3);
        ppIVar4 = (pIVar8->WindowsTempSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar8->WindowsTempSortBuffer).Data = ppIVar11;
      (pIVar8->WindowsTempSortBuffer).Capacity = (int)uVar12;
    }
    (pIVar8->WindowsTempSortBuffer).Size = 0;
    iVar16 = (pIVar8->Windows).Size;
    if ((pIVar8->WindowsTempSortBuffer).Capacity < iVar16) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar11 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar16 << 3,GImAllocatorUserData);
      ppIVar4 = (pIVar8->WindowsTempSortBuffer).Data;
      if (ppIVar4 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar11,ppIVar4,(long)(pIVar8->WindowsTempSortBuffer).Size << 3);
        ppIVar4 = (pIVar8->WindowsTempSortBuffer).Data;
        if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      }
      (pIVar8->WindowsTempSortBuffer).Data = ppIVar11;
      (pIVar8->WindowsTempSortBuffer).Capacity = iVar16;
    }
    uVar14 = (pIVar8->Windows).Size;
    uVar12 = (ulong)uVar14;
    if (uVar14 != 0) {
      uVar19 = 0;
      do {
        if ((long)(int)uVar12 <= (long)uVar19) {
LAB_00149c46:
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.h"
                        ,0x583,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        pIVar10 = (pIVar8->Windows).Data[uVar19];
        if ((pIVar10->Active != true) || ((pIVar10->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar8->WindowsTempSortBuffer,pIVar10);
        }
        uVar19 = uVar19 + 1;
        uVar14 = (pIVar8->Windows).Size;
        uVar12 = (ulong)uVar14;
      } while (uVar19 != uVar12);
    }
    uVar20 = (pIVar8->WindowsTempSortBuffer).Size;
    if (uVar14 != uVar20) {
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                    ,0x10a4,"void ImGui::EndFrame()");
    }
    (pIVar8->WindowsTempSortBuffer).Size = uVar14;
    (pIVar8->Windows).Size = uVar20;
    iVar16 = (pIVar8->WindowsTempSortBuffer).Capacity;
    (pIVar8->WindowsTempSortBuffer).Capacity = (pIVar8->Windows).Capacity;
    (pIVar8->Windows).Capacity = iVar16;
    ppIVar4 = (pIVar8->WindowsTempSortBuffer).Data;
    (pIVar8->WindowsTempSortBuffer).Data = (pIVar8->Windows).Data;
    (pIVar8->Windows).Data = ppIVar4;
    (pIVar8->IO).MetricsActiveWindows = pIVar8->WindowsActiveCount;
    ((pIVar8->IO).Fonts)->Locked = false;
    (pIVar8->IO).MouseWheel = 0.0;
    (pIVar8->IO).MouseWheelH = 0.0;
    iVar16 = (pIVar8->IO).InputQueueCharacters.Capacity;
    if (iVar16 < 0) {
      iVar16 = iVar16 / 2 + iVar16;
      iVar18 = 0;
      if (0 < iVar16) {
        iVar18 = iVar16;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar18 * 2),GImAllocatorUserData);
      puVar5 = (pIVar8->IO).InputQueueCharacters.Data;
      if (puVar5 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar5,(long)(pIVar8->IO).InputQueueCharacters.Size * 2);
        puVar5 = (pIVar8->IO).InputQueueCharacters.Data;
        if ((puVar5 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
      }
      (pIVar8->IO).InputQueueCharacters.Data = __dest;
      (pIVar8->IO).InputQueueCharacters.Capacity = iVar18;
    }
    (pIVar8->IO).InputQueueCharacters.Size = 0;
    (pIVar8->IO).NavInputs[0] = 0.0;
    (pIVar8->IO).NavInputs[1] = 0.0;
    (pIVar8->IO).NavInputs[2] = 0.0;
    (pIVar8->IO).NavInputs[3] = 0.0;
    (pIVar8->IO).NavInputs[4] = 0.0;
    (pIVar8->IO).NavInputs[5] = 0.0;
    (pIVar8->IO).NavInputs[6] = 0.0;
    (pIVar8->IO).NavInputs[7] = 0.0;
    (pIVar8->IO).NavInputs[8] = 0.0;
    (pIVar8->IO).NavInputs[9] = 0.0;
    (pIVar8->IO).NavInputs[10] = 0.0;
    (pIVar8->IO).NavInputs[0xb] = 0.0;
    (pIVar8->IO).NavInputs[0xc] = 0.0;
    (pIVar8->IO).NavInputs[0xd] = 0.0;
    (pIVar8->IO).NavInputs[0xe] = 0.0;
    (pIVar8->IO).NavInputs[0xf] = 0.0;
    (pIVar8->IO).NavInputs[0x10] = 0.0;
    (pIVar8->IO).NavInputs[0x11] = 0.0;
    (pIVar8->IO).NavInputs[0x12] = 0.0;
    (pIVar8->IO).NavInputs[0x13] = 0.0;
    (pIVar8->IO).NavInputs[0x14] = 0.0;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}